

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

void __thiscall webrtc::Matrix<std::complex<float>_>::Resize(Matrix<std::complex<float>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
            (&this->data_,this->num_columns_ * this->num_rows_);
  std::vector<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>::resize
            (&this->elements_,this->num_rows_);
  sVar1 = this->num_rows_;
  if (sVar1 != 0) {
    sVar2 = this->num_columns_;
    lVar3 = 0;
    sVar4 = 0;
    do {
      (this->elements_).
      super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar4] =
           (complex<float> *)
           ((long)&((this->data_).
                    super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar3);
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + sVar2 * 8;
    } while (sVar1 != sVar4);
  }
  return;
}

Assistant:

void Resize() {
    size_t size = num_rows_ * num_columns_;
    data_.resize(size);
    elements_.resize(num_rows_);

    for (size_t i = 0; i < num_rows_; ++i) {
      elements_[i] = &data_[i * num_columns_];
    }
  }